

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

TimeZone * icu_63::anon_unknown_17::createSystemTimeZone(UnicodeString *id,UErrorCode *ec)

{
  UBool UVar1;
  UResourceBundle *top_00;
  OlsonTimeZone *this;
  UResourceBundle *res_00;
  OlsonTimeZone *local_120;
  UResourceBundle *top;
  UResourceBundle res;
  TimeZone *z;
  UErrorCode *ec_local;
  UnicodeString *id_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    res.fSize = 0;
    res._196_4_ = 0;
    ures_initStackObject_63((UResourceBundle *)&top);
    res_00 = (UResourceBundle *)&top;
    top_00 = openOlsonResource(id,res_00,ec);
    UVar1 = ::U_SUCCESS(*ec);
    if (UVar1 != '\0') {
      this = (OlsonTimeZone *)UMemory::operator_new((UMemory *)0xe0,(size_t)res_00);
      local_120 = (OlsonTimeZone *)0x0;
      if (this != (OlsonTimeZone *)0x0) {
        OlsonTimeZone::OlsonTimeZone(this,top_00,(UResourceBundle *)&top,id,ec);
        local_120 = this;
      }
      res._192_8_ = local_120;
    }
    ures_close_63((UResourceBundle *)&top);
    ures_close_63(top_00);
    UVar1 = ::U_FAILURE(*ec);
    if (UVar1 != '\0') {
      if (res._192_8_ != 0) {
        (**(code **)(*(long *)res._192_8_ + 8))();
      }
      res.fSize = 0;
      res._196_4_ = 0;
    }
    id_local = (UnicodeString *)res._192_8_;
  }
  else {
    id_local = (UnicodeString *)0x0;
  }
  return (TimeZone *)id_local;
}

Assistant:

TimeZone*
createSystemTimeZone(const UnicodeString& id, UErrorCode& ec) {
    if (U_FAILURE(ec)) {
        return NULL;
    }
    TimeZone* z = 0;
    UResourceBundle res;
    ures_initStackObject(&res);
    U_DEBUG_TZ_MSG(("pre-err=%s\n", u_errorName(ec)));
    UResourceBundle *top = openOlsonResource(id, res, ec);
    U_DEBUG_TZ_MSG(("post-err=%s\n", u_errorName(ec)));
    if (U_SUCCESS(ec)) {
        z = new OlsonTimeZone(top, &res, id, ec);
        if (z == NULL) {
          U_DEBUG_TZ_MSG(("cstz: olson time zone failed to initialize - err %s\n", u_errorName(ec)));
        }
    }
    ures_close(&res);
    ures_close(top);
    if (U_FAILURE(ec)) {
        U_DEBUG_TZ_MSG(("cstz: failed to create, err %s\n", u_errorName(ec)));
        delete z;
        z = 0;
    }
    return z;
}